

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer.h
# Opt level: O0

string * mp::GenericVarNamer::vname_abi_cxx11_(int i)

{
  string *in_RDI;
  string *__rhs;
  string *__lhs;
  string local_30 [44];
  
  __lhs = local_30;
  __rhs = in_RDI;
  std::__cxx11::to_string((int)((ulong)in_RDI >> 0x20));
  std::operator+((char *)__lhs,__rhs);
  std::__cxx11::string::~string(local_30);
  return in_RDI;
}

Assistant:

static std::string vname(int i)
  { return "x" + std::to_string(i+1); }